

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLoad.c
# Opt level: O3

void Abc_SclUpdateLoad(SC_Man *p,Abc_Obj_t *pObj,SC_Cell *pOld,SC_Cell *pNew)

{
  undefined8 uVar1;
  undefined8 uVar2;
  SC_Pair SVar3;
  uint uVar4;
  int *piVar5;
  void **ppvVar6;
  SC_Pair *pSVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  SC_Pair SVar11;
  
  uVar8 = (ulong)(pObj->vFanins).nSize;
  if (0 < (long)uVar8) {
    piVar5 = (pObj->vFanins).pArray;
    ppvVar6 = pObj->pNtk->vObjs->pArray;
    pSVar7 = p->pLoads;
    uVar4 = (pOld->vPins).nSize;
    uVar10 = 0;
    uVar9 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar9 = uVar10;
    }
    do {
      if ((uVar9 == uVar10) || ((long)(pNew->vPins).nSize <= (long)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar4 = *(uint *)((long)ppvVar6[piVar5[uVar10]] + 0x10);
      uVar1 = *(undefined8 *)((long)(pNew->vPins).pArray[uVar10] + 0x10);
      uVar2 = *(undefined8 *)((long)(pOld->vPins).pArray[uVar10] + 0x10);
      SVar3 = pSVar7[uVar4];
      SVar11.rise = SVar3.rise + ((float)uVar1 - (float)uVar2);
      SVar11.fall = SVar3.fall + ((float)((ulong)uVar1 >> 0x20) - (float)((ulong)uVar2 >> 0x20));
      pSVar7[uVar4] = SVar11;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  return;
}

Assistant:

void Abc_SclUpdateLoad( SC_Man * p, Abc_Obj_t * pObj, SC_Cell * pOld, SC_Cell * pNew )
{
    Abc_Obj_t * pFanin;
    int k;
    Abc_ObjForEachFanin( pObj, pFanin, k )
    {
        SC_Pair * pLoad = Abc_SclObjLoad( p, pFanin );
        SC_Pin * pPinOld = SC_CellPin( pOld, k );
        SC_Pin * pPinNew = SC_CellPin( pNew, k );
        pLoad->rise += pPinNew->rise_cap - pPinOld->rise_cap;
        pLoad->fall += pPinNew->fall_cap - pPinOld->fall_cap;
    }
}